

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O3

void allphone_backtrace(allphone_search_t *allphs,int32 f,int32 *out_score)

{
  int32 n;
  bool bVar1;
  void *pvVar2;
  long *plVar3;
  undefined2 *ptr;
  glist_t pgVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint n_00;
  uint uVar8;
  uint n_01;
  
  allphone_clear_segments(allphs);
  n_01 = allphs->history->n_valid;
  do {
    if ((int)n_01 < 2) {
      return;
    }
    n_01 = n_01 - 1;
    pvVar2 = blkarray_list_get(allphs->history,n_01);
    iVar7 = *(int *)((long)pvVar2 + 0x10);
  } while (f < iVar7);
  iVar6 = -0x80000000;
  uVar8 = 0xffffffff;
  do {
    pvVar2 = blkarray_list_get(allphs->history,n_01);
    iVar5 = *(int *)((long)pvVar2 + 8);
    n_00 = n_01;
    if (*(int *)((long)pvVar2 + 8) <= iVar6 || *(int *)((long)pvVar2 + 0x10) != iVar7) {
      iVar5 = iVar6;
      n_00 = uVar8;
    }
  } while ((*(int *)((long)pvVar2 + 0x10) == iVar7) &&
          (bVar1 = 1 < n_01, n_01 = n_01 - 1, iVar6 = iVar5, uVar8 = n_00, bVar1));
  if (-1 < (int)n_00) {
    if (out_score != (int32 *)0x0) {
      *out_score = iVar5;
    }
    if (n_00 != 0) {
      do {
        plVar3 = (long *)blkarray_list_get(allphs->history,n_00);
        ptr = (undefined2 *)
              __ckd_calloc__(1,0x14,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0x336);
        *ptr = *(undefined2 *)(*plVar3 + 0x5c);
        if (*(int32 *)((long)plVar3 + 0x14) < 1) {
          *(undefined4 *)(ptr + 2) = 0;
          *(int *)(ptr + 4) = (int)plVar3[2];
          iVar7 = (int)plVar3[1];
        }
        else {
          pvVar2 = blkarray_list_get(allphs->history,*(int32 *)((long)plVar3 + 0x14));
          n = *(int32 *)((long)plVar3 + 0x14);
          *(int *)(ptr + 2) = *(int *)((long)pvVar2 + 0x10) + 1;
          *(int *)(ptr + 4) = (int)plVar3[2];
          iVar7 = (int)plVar3[1];
          if (0 < n) {
            pvVar2 = blkarray_list_get(allphs->history,n);
            iVar7 = iVar7 - *(int *)((long)pvVar2 + 8);
          }
        }
        iVar6 = *(int *)((long)plVar3 + 0xc);
        *(int *)(ptr + 6) = iVar7 - iVar6;
        *(int *)(ptr + 8) = iVar6;
        pgVar4 = glist_add_ptr(allphs->segments,ptr);
        allphs->segments = pgVar4;
        n_00 = *(uint *)((long)plVar3 + 0x14);
      } while (0 < (int)n_00);
    }
  }
  return;
}

Assistant:

static void
allphone_backtrace(allphone_search_t * allphs, int32 f, int32 *out_score)
{
    int32 best, hist_idx, best_idx;
    int32 frm, last_frm;
    history_t *h;
    phseg_t *s;

    /* Clear old list */
    allphone_clear_segments(allphs);

    frm = last_frm = f;
    /* Find the first history entry for the requested frame */
    hist_idx = blkarray_list_n_valid(allphs->history) - 1;
    while (hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        if (h->ef <= f) {
            frm = last_frm = h->ef;
            break;
        }
        hist_idx--;
    }

    if (hist_idx < 0)
        return;

    /* Find bestscore */
    best = MAX_NEG_INT32;
    best_idx = -1;
    while (frm == last_frm && hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        frm = h->ef;
        if (h->score > best && frm == last_frm) {
            best = h->score;
            best_idx = hist_idx;
        }
        hist_idx--;
    }

    if (best_idx < 0)
        return;

    if (out_score)
        *out_score = best;

    /* Backtrace */
    while (best_idx > 0) {
        h = blkarray_list_get(allphs->history, best_idx);
        s = (phseg_t *) ckd_calloc(1, sizeof(phseg_t));
        s->ci = h->phmm->ci;
        s->sf =
            (h->hist >
             0) ? ((history_t *) blkarray_list_get(allphs->history,
                                                   h->hist))->ef + 1 : 0;
        s->ef = h->ef;
        s->score = ascore(allphs, h);
        s->tscore = h->tscore;
        allphs->segments = glist_add_ptr(allphs->segments, s);

        best_idx = h->hist;
    }

    return;
}